

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O2

wchar_t archive_read_format_lha_read_header(archive_read *a,archive_entry *entry)

{
  archive_string *as;
  byte bVar1;
  ushort uVar2;
  lha *lha;
  char cVar3;
  uint16_t uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  uchar *p;
  char *pcVar10;
  size_t sVar11;
  void *pvVar12;
  ushort *pp;
  short *pp_00;
  byte *pbVar13;
  time_t tVar14;
  ulong uVar15;
  size_t sVar16;
  int *piVar17;
  wchar_t *pwVar18;
  mode_t mVar19;
  size_t sVar20;
  char *pcVar21;
  ulong uVar22;
  byte bVar23;
  void *pvVar24;
  bool bVar25;
  size_t local_80;
  size_t extdsize;
  size_t sStack_70;
  size_t local_68;
  archive_string local_58;
  void *local_40;
  int64_t *local_38;
  
  (a->archive).archive_format = 0xb0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "lha";
  }
  lha = (lha *)a->format->data;
  lha->decompress_init = '\0';
  lha->end_of_entry = '\0';
  lha->end_of_entry_cleanup = '\0';
  lha->entry_unconsumed = 0;
  pcVar10 = (char *)__archive_read_ahead(a,0x16,(ssize_t *)0x0);
  if (pcVar10 == (char *)0x0) {
    pcVar10 = (char *)__archive_read_ahead(a,1,(ssize_t *)0x0);
    if (pcVar10 == (char *)0x0) {
      return L'\x01';
    }
    if (*pcVar10 == '\0') {
      return L'\x01';
    }
LAB_003d40f6:
    truncated_error(a);
    return L'\xffffffe2';
  }
  if (lha->found_first_header == '\0') {
    cVar3 = *pcVar10;
    if (cVar3 != 'M') goto LAB_003d40a2;
    if (pcVar10[1] != 'Z') goto LAB_003d409e;
    local_80 = 0x1000;
    while( true ) {
      while (pvVar12 = __archive_read_ahead(a,local_80,(ssize_t *)&extdsize), pvVar12 == (void *)0x0
            ) {
        bVar25 = local_80 < 0x32;
        local_80 = local_80 >> 1;
        if (bVar25) goto LAB_003d4715;
      }
      if ((long)extdsize < 0x16) break;
      uVar22 = extdsize + (long)pvVar12;
      for (pvVar24 = pvVar12; (long)pvVar24 + 0x16U < uVar22;
          pvVar24 = (void *)((long)pvVar24 + sVar11)) {
        sVar11 = lha_check_header_format(pvVar24);
        if (sVar11 == 0) {
          __archive_read_consume(a,(long)pvVar24 - (long)pvVar12);
          pcVar10 = (char *)__archive_read_ahead(a,1,(ssize_t *)0x0);
          if (pcVar10 == (char *)0x0) goto LAB_003d40f6;
          goto LAB_003d409e;
        }
      }
      __archive_read_consume(a,(long)pvVar24 - (long)pvVar12);
    }
LAB_003d4715:
    pcVar10 = "Couldn\'t find out LHa header";
LAB_003d40c2:
    iVar5 = 0x54;
    goto LAB_003d40c4;
  }
LAB_003d409e:
  cVar3 = *pcVar10;
LAB_003d40a2:
  if (cVar3 == '\0') {
    return L'\x01';
  }
  sVar11 = lha_check_header_format(pcVar10);
  if (sVar11 != 0) {
    pcVar10 = "Bad LHa file";
    goto LAB_003d40c2;
  }
  lha->found_first_header = '\x01';
  lha->header_size = 0;
  lha->level = pcVar10[0x14];
  pcVar21 = lha->method;
  lha->method[0] = pcVar10[3];
  lha->method[1] = pcVar10[4];
  lha->method[2] = pcVar10[5];
  iVar5 = bcmp(pcVar21,"lhd",3);
  lha->directory = iVar5 == 0;
  iVar6 = bcmp(pcVar21,"lh0",3);
  if (iVar6 == 0) {
    bVar25 = false;
  }
  else {
    iVar6 = bcmp(pcVar21,"lz4",3);
    bVar25 = iVar6 != 0;
  }
  lha->entry_is_compressed = bVar25;
  mVar19 = 0x1b6;
  if (iVar5 == 0) {
    mVar19 = 0x1ff;
  }
  lha->setflag = 0;
  lha->compsize = 0;
  lha->origsize = 0;
  lha->birthtime = 0;
  lha->birthtime_tv_nsec = 0;
  lha->mtime = 0;
  lha->mtime_tv_nsec = 0;
  lha->atime = 0;
  lha->atime_tv_nsec = 0;
  lha->mode = mVar19;
  (lha->dirname).length = 0;
  (lha->filename).length = 0;
  lha->dos_attr = '\0';
  lha->uid = 0;
  lha->gid = 0;
  lha->sconv = lha->opt_sconv;
  if (3 < (byte)pcVar10[0x14]) {
    archive_set_error(&a->archive,0x54,"Unsupported LHa header level %d");
    return L'\xffffffe2';
  }
  as = &lha->filename;
  switch(pcVar10[0x14]) {
  case '\0':
    pbVar13 = (byte *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
    if (pbVar13 == (byte *)0x0) goto LAB_003d47f3;
    lha->header_size = (ulong)*pbVar13 + 2;
    bVar1 = pbVar13[1];
    lha->compsize = (ulong)*(uint *)(pbVar13 + 7);
    lha->origsize = (ulong)*(uint *)(pbVar13 + 0xb);
    tVar14 = lha_dos_time(pbVar13 + 0xf);
    lha->mtime = tVar14;
    bVar23 = pbVar13[0x15];
    uVar22 = (ulong)bVar23;
    iVar5 = ((int)lha->header_size - (uint)bVar23) + -0x18;
    if (iVar5 != -2 && (iVar5 < 0 || 0xdd < bVar23)) {
      pcVar10 = "Invalid LHa header";
      goto LAB_003d40c2;
    }
    pvVar12 = __archive_read_ahead(a,lha->header_size,(ssize_t *)0x0);
    if (pvVar12 == (void *)0x0) goto LAB_003d47f3;
    (lha->filename).length = 0;
    local_40 = (void *)((long)pvVar12 + 0x16);
    archive_strncat(as,local_40,uVar22);
    if (-1 < iVar5) {
      lha->crc = *(uint16_t *)((long)local_40 + uVar22);
      *(byte *)&lha->setflag = (byte)lha->setflag | 8;
    }
    bVar23 = 0;
    for (sVar11 = 2; lha->header_size != sVar11; sVar11 = sVar11 + 1) {
      bVar23 = bVar23 + *(char *)((long)pvVar12 + sVar11);
    }
    if (((0 < iVar5) && (*(char *)((long)pvVar12 + uVar22 + 0x18) == 'U')) && (iVar5 == 0xc)) {
      lha->mtime = (ulong)*(uint *)((long)pvVar12 + uVar22 + 0x1a);
      lha->mode = (uint)*(ushort *)((long)pvVar12 + uVar22 + 0x1e);
      lha->uid = (ulong)*(ushort *)((long)pvVar12 + uVar22 + 0x20);
      lha->gid = (ulong)*(ushort *)((long)pvVar12 + uVar22 + 0x22);
      *(byte *)&lha->setflag = (byte)lha->setflag | 4;
    }
    __archive_read_consume(a,lha->header_size);
    wVar8 = L'\0';
    if (bVar23 != bVar1) {
      pcVar10 = "LHa header sum error";
      iVar5 = -1;
      goto LAB_003d40c4;
    }
    goto LAB_003d473a;
  case '\x01':
    pbVar13 = (byte *)__archive_read_ahead(a,0x1b,(ssize_t *)0x0);
    if (pbVar13 == (byte *)0x0) {
LAB_003d45bf:
      truncated_error(a);
      goto LAB_003d45c7;
    }
    lha->header_size = (ulong)*pbVar13 + 2;
    bVar1 = pbVar13[1];
    lha->compsize = (ulong)*(uint *)(pbVar13 + 7);
    lha->origsize = (ulong)*(uint *)(pbVar13 + 0xb);
    tVar14 = lha_dos_time(pbVar13 + 0xf);
    lha->mtime = tVar14;
    bVar23 = pbVar13[0x15];
    uVar22 = (ulong)bVar23;
    if ((bVar23 < 0xe7) && ((int)(uint)bVar23 <= (int)lha->header_size + -0x1b)) {
      pvVar12 = __archive_read_ahead(a,lha->header_size,(ssize_t *)0x0);
      if (pvVar12 != (void *)0x0) {
        sVar11 = 2;
        pvVar24 = (void *)((long)pvVar12 + 0x16);
        uVar15 = 0;
LAB_003d44c9:
        if (uVar22 != uVar15) goto code_r0x003d44d2;
        (lha->filename).length = 0;
        local_40 = pvVar12;
        local_38 = &lha->compsize;
        archive_strncat(as,pvVar24,uVar22);
        lha->crc = *(uint16_t *)((long)pvVar24 + uVar22);
        *(byte *)&lha->setflag = (byte)lha->setflag | 8;
        bVar23 = 0;
        for (; lha->header_size != sVar11; sVar11 = sVar11 + 1) {
          bVar23 = bVar23 + *(char *)((long)local_40 + sVar11);
        }
        __archive_read_consume(a,lha->header_size - 2);
        wVar8 = lha_read_file_extended_header
                          (a,lha,(uint16_t *)0x0,L'\x02',lha->compsize + 2,&extdsize);
        if (L'\xffffffeb' < wVar8) {
          *local_38 = (*local_38 - extdsize) + 2;
          if (bVar23 == bVar1) {
            wVar8 = wVar8 & wVar8 >> 0x1f;
            break;
          }
          pcVar21 = "LHa header sum error";
          iVar5 = -1;
          goto LAB_003d442e;
        }
        break;
      }
      truncated_error(a);
    }
    else {
LAB_003d44dd:
      archive_set_error(&a->archive,0x54,"Invalid LHa header");
    }
    wVar8 = L'\xffffffe2';
    break;
  case '\x02':
    pp = (ushort *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
    if (pp == (ushort *)0x0) goto LAB_003d45bf;
    uVar2 = *pp;
    lha->header_size = (ulong)uVar2;
    lha->compsize = (ulong)*(uint *)((long)pp + 7);
    lha->origsize = (ulong)*(uint *)((long)pp + 0xb);
    lha->mtime = (ulong)*(uint *)((long)pp + 0xf);
    uVar4 = *(uint16_t *)((long)pp + 0x15);
    *(byte *)&lha->setflag = (byte)lha->setflag | 8;
    lha->crc = uVar4;
    if ((ulong)uVar2 < 0x18) {
      pcVar21 = "Invalid LHa header size";
      goto LAB_003d442c;
    }
    uVar4 = lha_crc16(0,pp,0x18);
    local_58.s = (char *)CONCAT62(local_58.s._2_6_,uVar4);
    __archive_read_consume(a,0x18);
    wVar8 = lha_read_file_extended_header
                      (a,lha,(uint16_t *)&local_58,L'\x02',lha->header_size - 0x18,&extdsize);
    if (L'\xffffffeb' < wVar8) {
      uVar7 = ((int)lha->header_size - (int)extdsize) - 0x18;
      if (0 < (int)uVar7) {
        uVar22 = (ulong)uVar7;
        pvVar12 = __archive_read_ahead(a,uVar22,(ssize_t *)0x0);
        if (pvVar12 == (void *)0x0) goto LAB_003d45bf;
        uVar4 = lha_crc16((uint16_t)local_58.s,pvVar12,uVar22);
        local_58.s = (char *)CONCAT62(local_58.s._2_6_,uVar4);
        __archive_read_consume(a,uVar22);
      }
      if ((uint16_t)local_58.s != lha->header_crc) goto LAB_003d4709;
    }
    break;
  case '\x03':
    pp_00 = (short *)__archive_read_ahead(a,0x1c,(ssize_t *)0x0);
    if (pp_00 == (short *)0x0) goto LAB_003d45bf;
    if (*pp_00 == 4) {
      uVar7 = *(uint *)(pp_00 + 0xc);
      lha->header_size = (ulong)uVar7;
      lha->compsize = (ulong)*(uint *)((long)pp_00 + 7);
      lha->origsize = (ulong)*(uint *)((long)pp_00 + 0xb);
      lha->mtime = (ulong)*(uint *)((long)pp_00 + 0xf);
      uVar4 = *(uint16_t *)((long)pp_00 + 0x15);
      *(byte *)&lha->setflag = (byte)lha->setflag | 8;
      lha->crc = uVar4;
      if (0x1f < (ulong)uVar7) {
        uVar4 = lha_crc16(0,pp_00,0x1c);
        local_58.s = (char *)CONCAT62(local_58.s._2_6_,uVar4);
        __archive_read_consume(a,0x1c);
        wVar8 = lha_read_file_extended_header
                          (a,lha,(uint16_t *)&local_58,L'\x04',lha->header_size - 0x1c,&extdsize);
        if ((wVar8 < L'\xffffffec') || ((uint16_t)local_58.s == lha->header_crc)) break;
LAB_003d4709:
        pcVar21 = "LHa header CRC error";
        goto LAB_003d442c;
      }
    }
    pcVar21 = "Invalid LHa header";
LAB_003d442c:
    iVar5 = 0x54;
LAB_003d442e:
    archive_set_error(&a->archive,iVar5,pcVar21);
LAB_003d45c7:
    wVar8 = L'\xffffffe2';
  }
  if (wVar8 < L'\xffffffec') {
    return wVar8;
  }
LAB_003d473a:
  if ((lha->directory == '\0') && ((lha->filename).length == 0)) {
LAB_003d47f3:
    truncated_error(a);
    return L'\xffffffe2';
  }
  archive_string_concat(&lha->dirname,as);
  local_58.s = (char *)0x0;
  local_58.length = 0;
  local_58.buffer_length = 0;
  extdsize = 0;
  sStack_70 = 0;
  local_68 = 0;
  archive_string_concat(&local_58,&lha->dirname);
  if ((lha->mode & 0xf000) == 0xa000) {
    pcVar21 = strchr(local_58.s,0x7c);
    if (pcVar21 == (char *)0x0) {
      archive_set_error(&a->archive,0x54,"Unknown symlink-name");
      archive_string_free(&local_58);
      archive_string_free((archive_string *)&extdsize);
      return L'\xffffffe7';
    }
    sVar16 = strlen(pcVar21 + 1);
    sStack_70 = 0;
    archive_strncat((archive_string *)&extdsize,pcVar21 + 1,sVar16);
    *pcVar21 = '\0';
    local_58.length = strlen(local_58.s);
  }
  else {
    lha->mode = (lha->mode & 0xffff0fff) + (uint)(lha->directory == '\0') * 0x4000 + 0x4000;
  }
  if (((lha->setflag & 4) == 0) && ((lha->dos_attr & 1) != 0)) {
    *(byte *)&lha->mode = (byte)lha->mode & 0x6d;
  }
  wVar9 = _archive_entry_copy_pathname_l(entry,local_58.s,local_58.length,lha->sconv);
  if (wVar9 == L'\0') {
LAB_003d488c:
    archive_string_free(&local_58);
    if (sStack_70 == 0) {
      archive_entry_set_symlink(entry,(char *)0x0);
LAB_003d4931:
      archive_string_free((archive_string *)&extdsize);
      if (pcVar10[0x14] == '\0') {
        pwVar18 = archive_entry_pathname_w(entry);
        if (pwVar18 != (wchar_t *)0x0) {
          (lha->ws).length = 0;
          sVar16 = wcslen(pwVar18);
          archive_wstrncat(&lha->ws,pwVar18,sVar16);
          pwVar18 = (lha->ws).s;
          sVar11 = (lha->ws).length;
          for (sVar20 = 0; sVar11 != sVar20; sVar20 = sVar20 + 1) {
            if (pwVar18[sVar20] == L'\\') {
              pwVar18[sVar20] = L'/';
            }
          }
          archive_entry_copy_pathname_w(entry,pwVar18);
        }
        pwVar18 = archive_entry_symlink_w(entry);
        if (pwVar18 != (wchar_t *)0x0) {
          (lha->ws).length = 0;
          sVar16 = wcslen(pwVar18);
          archive_wstrncat(&lha->ws,pwVar18,sVar16);
          pwVar18 = (lha->ws).s;
          sVar11 = (lha->ws).length;
          for (sVar20 = 0; sVar11 != sVar20; sVar20 = sVar20 + 1) {
            if (pwVar18[sVar20] == L'\\') {
              pwVar18[sVar20] = L'/';
            }
          }
          archive_entry_copy_symlink_w(entry,pwVar18);
        }
      }
      archive_entry_set_mode(entry,lha->mode);
      archive_entry_set_uid(entry,lha->uid);
      archive_entry_set_gid(entry,lha->gid);
      if ((lha->uname).length != 0) {
        archive_entry_set_uname(entry,(lha->uname).s);
      }
      if ((lha->gname).length != 0) {
        archive_entry_set_gname(entry,(lha->gname).s);
      }
      if ((lha->setflag & 1) == 0) {
        archive_entry_unset_birthtime(entry);
        archive_entry_unset_ctime(entry);
      }
      else {
        archive_entry_set_birthtime(entry,lha->birthtime,lha->birthtime_tv_nsec);
        archive_entry_set_ctime(entry,lha->birthtime,lha->birthtime_tv_nsec);
      }
      archive_entry_set_mtime(entry,lha->mtime,lha->mtime_tv_nsec);
      if ((lha->setflag & 2) == 0) {
        archive_entry_unset_atime(entry);
      }
      else {
        archive_entry_set_atime(entry,lha->atime,lha->atime_tv_nsec);
      }
      if ((lha->directory == '\0') &&
         (pcVar10 = archive_entry_symlink(entry), pcVar10 == (char *)0x0)) {
        archive_entry_set_size(entry,lha->origsize);
      }
      else {
        archive_entry_unset_size(entry);
      }
      lha->entry_bytes_remaining = lha->compsize;
      lha->entry_offset = 0;
      lha->entry_crc_calculated = 0;
      if (lha->compsize == 0 || lha->directory != '\0') {
        lha->end_of_entry = '\x01';
      }
      sprintf(lha->format_name,"lha -%c%c%c-",(ulong)(uint)(int)lha->method[0],
              (ulong)(uint)(int)lha->method[1],(ulong)(uint)(int)lha->method[2]);
      (a->archive).archive_format_name = lha->format_name;
      return wVar8;
    }
    wVar9 = _archive_entry_copy_symlink_l(entry,(char *)extdsize,sStack_70,lha->sconv);
    if (wVar9 == L'\0') goto LAB_003d4931;
    piVar17 = __errno_location();
    if (*piVar17 != 0xc) {
      archive_string_conversion_charset_name(lha->sconv);
      archive_set_error(&a->archive,0x54,"Linkname cannot be converted from %s to current locale.");
      wVar8 = L'\xffffffec';
      goto LAB_003d4931;
    }
    pcVar10 = "Can\'t allocate memory for Linkname";
  }
  else {
    piVar17 = __errno_location();
    if (*piVar17 != 0xc) {
      wVar8 = L'\xffffffec';
      archive_string_conversion_charset_name(lha->sconv);
      archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.");
      goto LAB_003d488c;
    }
    pcVar10 = "Can\'t allocate memory for Pathname";
  }
  iVar5 = 0xc;
LAB_003d40c4:
  archive_set_error(&a->archive,iVar5,pcVar10);
  return L'\xffffffe2';
code_r0x003d44d2:
  pcVar21 = (char *)((long)pvVar24 + uVar15);
  uVar15 = uVar15 + 1;
  if (*pcVar21 == -1) goto LAB_003d44dd;
  goto LAB_003d44c9;
}

Assistant:

static int
archive_read_format_lha_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct archive_string linkname;
	struct archive_string pathname;
	struct lha *lha;
	const unsigned char *p;
	const char *signature;
	int err;
	
	a->archive.archive_format = ARCHIVE_FORMAT_LHA;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "lha";

	lha = (struct lha *)(a->format->data);
	lha->decompress_init = 0;
	lha->end_of_entry = 0;
	lha->end_of_entry_cleanup = 0;
	lha->entry_unconsumed = 0;

	if ((p = __archive_read_ahead(a, H_SIZE, NULL)) == NULL) {
		/*
		 * LHa archiver added 0 to the tail of its archive file as
		 * the mark of the end of the archive.
		 */
		signature = __archive_read_ahead(a, sizeof(signature[0]), NULL);
		if (signature == NULL || signature[0] == 0)
			return (ARCHIVE_EOF);
		return (truncated_error(a));
	}

	signature = (const char *)p;
	if (lha->found_first_header == 0 &&
	    signature[0] == 'M' && signature[1] == 'Z') {
                /* This is an executable?  Must be self-extracting... 	*/
		err = lha_skip_sfx(a);
		if (err < ARCHIVE_WARN)
			return (err);

		if ((p = __archive_read_ahead(a, sizeof(*p), NULL)) == NULL)
			return (truncated_error(a));
		signature = (const char *)p;
	}
	/* signature[0] == 0 means the end of an LHa archive file. */
	if (signature[0] == 0)
		return (ARCHIVE_EOF);

	/*
	 * Check the header format and method type.
	 */
	if (lha_check_header_format(p) != 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Bad LHa file");
		return (ARCHIVE_FATAL);
	}

	/* We've found the first header. */
	lha->found_first_header = 1;
	/* Set a default value and common data */
	lha->header_size = 0;
	lha->level = p[H_LEVEL_OFFSET];
	lha->method[0] = p[H_METHOD_OFFSET+1];
	lha->method[1] = p[H_METHOD_OFFSET+2];
	lha->method[2] = p[H_METHOD_OFFSET+3];
	if (memcmp(lha->method, "lhd", 3) == 0)
		lha->directory = 1;
	else
		lha->directory = 0;
	if (memcmp(lha->method, "lh0", 3) == 0 ||
	    memcmp(lha->method, "lz4", 3) == 0)
		lha->entry_is_compressed = 0;
	else
		lha->entry_is_compressed = 1;

	lha->compsize = 0;
	lha->origsize = 0;
	lha->setflag = 0;
	lha->birthtime = 0;
	lha->birthtime_tv_nsec = 0;
	lha->mtime = 0;
	lha->mtime_tv_nsec = 0;
	lha->atime = 0;
	lha->atime_tv_nsec = 0;
	lha->mode = (lha->directory)? 0777 : 0666;
	lha->uid = 0;
	lha->gid = 0;
	archive_string_empty(&lha->dirname);
	archive_string_empty(&lha->filename);
	lha->dos_attr = 0;
	if (lha->opt_sconv != NULL)
		lha->sconv = lha->opt_sconv;
	else
		lha->sconv = NULL;

	switch (p[H_LEVEL_OFFSET]) {
	case 0:
		err = lha_read_file_header_0(a, lha);
		break;
	case 1:
		err = lha_read_file_header_1(a, lha);
		break;
	case 2:
		err = lha_read_file_header_2(a, lha);
		break;
	case 3:
		err = lha_read_file_header_3(a, lha);
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported LHa header level %d", p[H_LEVEL_OFFSET]);
		err = ARCHIVE_FATAL;
		break;
	}
	if (err < ARCHIVE_WARN)
		return (err);


	if (!lha->directory && archive_strlen(&lha->filename) == 0)
		/* The filename has not been set */
		return (truncated_error(a));

	/*
	 * Make a pathname from a dirname and a filename.
	 */
	archive_string_concat(&lha->dirname, &lha->filename);
	archive_string_init(&pathname);
	archive_string_init(&linkname);
	archive_string_copy(&pathname, &lha->dirname);

	if ((lha->mode & AE_IFMT) == AE_IFLNK) {
		/*
	 	 * Extract the symlink-name if it's included in the pathname.
	 	 */
		if (!lha_parse_linkname(&linkname, &pathname)) {
			/* We couldn't get the symlink-name. */
			archive_set_error(&a->archive,
		    	    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unknown symlink-name");
			archive_string_free(&pathname);
			archive_string_free(&linkname);
			return (ARCHIVE_FAILED);
		}
	} else {
		/*
		 * Make sure a file-type is set.
		 * The mode has been overridden if it is in the extended data.
		 */
		lha->mode = (lha->mode & ~AE_IFMT) |
		    ((lha->directory)? AE_IFDIR: AE_IFREG);
	}
	if ((lha->setflag & UNIX_MODE_IS_SET) == 0 &&
	    (lha->dos_attr & 1) != 0)
		lha->mode &= ~(0222);/* read only. */

	/*
	 * Set basic file parameters.
	 */
	if (archive_entry_copy_pathname_l(entry, pathname.s,
	    pathname.length, lha->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(lha->sconv));
		err = ARCHIVE_WARN;
	}
	archive_string_free(&pathname);
	if (archive_strlen(&linkname) > 0) {
		if (archive_entry_copy_symlink_l(entry, linkname.s,
		    linkname.length, lha->sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Linkname cannot be converted "
			    "from %s to current locale.",
			    archive_string_conversion_charset_name(lha->sconv));
			err = ARCHIVE_WARN;
		}
	} else
		archive_entry_set_symlink(entry, NULL);
	archive_string_free(&linkname);
	/*
	 * When a header level is 0, there is a possibility that
	 * a pathname and a symlink has '\' character, a directory
	 * separator in DOS/Windows. So we should convert it to '/'.
	 */
	if (p[H_LEVEL_OFFSET] == 0)
		lha_replace_path_separator(lha, entry);

	archive_entry_set_mode(entry, lha->mode);
	archive_entry_set_uid(entry, lha->uid);
	archive_entry_set_gid(entry, lha->gid);
	if (archive_strlen(&lha->uname) > 0)
		archive_entry_set_uname(entry, lha->uname.s);
	if (archive_strlen(&lha->gname) > 0)
		archive_entry_set_gname(entry, lha->gname.s);
	if (lha->setflag & BIRTHTIME_IS_SET) {
		archive_entry_set_birthtime(entry, lha->birthtime,
		    lha->birthtime_tv_nsec);
		archive_entry_set_ctime(entry, lha->birthtime,
		    lha->birthtime_tv_nsec);
	} else {
		archive_entry_unset_birthtime(entry);
		archive_entry_unset_ctime(entry);
	}
	archive_entry_set_mtime(entry, lha->mtime, lha->mtime_tv_nsec);
	if (lha->setflag & ATIME_IS_SET)
		archive_entry_set_atime(entry, lha->atime,
		    lha->atime_tv_nsec);
	else
		archive_entry_unset_atime(entry);
	if (lha->directory || archive_entry_symlink(entry) != NULL)
		archive_entry_unset_size(entry);
	else
		archive_entry_set_size(entry, lha->origsize);

	/*
	 * Prepare variables used to read a file content.
	 */
	lha->entry_bytes_remaining = lha->compsize;
	lha->entry_offset = 0;
	lha->entry_crc_calculated = 0;

	/*
	 * This file does not have a content.
	 */
	if (lha->directory || lha->compsize == 0)
		lha->end_of_entry = 1;

	sprintf(lha->format_name, "lha -%c%c%c-",
	    lha->method[0], lha->method[1], lha->method[2]);
	a->archive.archive_format_name = lha->format_name;

	return (err);
}